

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetSourceFilesPropertiesCommand.cxx
# Opt level: O3

bool __thiscall
cmSetSourceFilesPropertiesCommand::InitialPass
          (cmSetSourceFilesPropertiesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  int iVar2;
  const_iterator propend;
  uint uVar3;
  ulong uVar4;
  const_iterator filebeg;
  string errors;
  string local_50;
  
  filebeg._M_current =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  propend._M_current =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)propend._M_current - (long)filebeg._M_current) < 0x21) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    bVar1 = false;
  }
  else {
    uVar4 = 0;
    if (filebeg._M_current != propend._M_current) {
      do {
        uVar3 = (uint)uVar4;
        iVar2 = std::__cxx11::string::compare((char *)filebeg._M_current);
        if ((((iVar2 == 0) ||
             (iVar2 = std::__cxx11::string::compare((char *)filebeg._M_current), iVar2 == 0)) ||
            (iVar2 = std::__cxx11::string::compare((char *)filebeg._M_current), iVar2 == 0)) ||
           (((iVar2 = std::__cxx11::string::compare((char *)filebeg._M_current), iVar2 == 0 ||
             (iVar2 = std::__cxx11::string::compare((char *)filebeg._M_current), iVar2 == 0)) ||
            (iVar2 = std::__cxx11::string::compare((char *)filebeg._M_current), iVar2 == 0))))
        break;
        uVar3 = uVar3 + 1;
        uVar4 = (ulong)uVar3;
        filebeg._M_current = filebeg._M_current + 1;
      } while (filebeg._M_current !=
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
      filebeg._M_current =
           (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      propend._M_current =
           (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      uVar4 = (ulong)uVar3;
    }
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    bVar1 = RunCommand((this->super_cmCommand).Makefile,filebeg,filebeg._M_current + uVar4,
                       filebeg._M_current + uVar4,propend,&local_50);
    if (!bVar1) {
      cmCommand::SetError(&this->super_cmCommand,&local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar1;
}

Assistant:

bool cmSetSourceFilesPropertiesCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // break the arguments into source file names and properties
  int numFiles = 0;
  std::vector<std::string>::const_iterator j;
  j = args.begin();
  // old style allows for specifier before PROPERTIES keyword
  while (j != args.end() && *j != "ABSTRACT" && *j != "WRAP_EXCLUDE" &&
         *j != "GENERATED" && *j != "COMPILE_FLAGS" &&
         *j != "OBJECT_DEPENDS" && *j != "PROPERTIES") {
    numFiles++;
    ++j;
  }

  // now call the worker function
  std::string errors;
  bool ret = cmSetSourceFilesPropertiesCommand::RunCommand(
    this->Makefile, args.begin(), args.begin() + numFiles,
    args.begin() + numFiles, args.end(), errors);
  if (!ret) {
    this->SetError(errors);
  }
  return ret;
}